

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

bool matchit::impl::
     matchPatternRangeImpl<0ul,0ul,1ul,std::_Rb_tree_const_iterator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>&,std::tuple<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::Context<mathiu::impl::Product_const*,bool>>
               (long *rangeBegin,ExprPtr *patternTuple)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = *rangeBegin;
  bVar1 = mathiu::impl::equal(patternTuple + 3,(ExprPtr *)(lVar2 + 0x20));
  if (bVar1) {
    bVar1 = mathiu::impl::equal(patternTuple + 2,(ExprPtr *)(lVar2 + 0x30));
    if (bVar1) {
      lVar2 = std::_Rb_tree_increment((_Rb_tree_node_base *)*rangeBegin);
      bVar1 = mathiu::impl::equal(patternTuple + 1,(ExprPtr *)(lVar2 + 0x20));
      if (bVar1) {
        bVar1 = mathiu::impl::equal(patternTuple,(ExprPtr *)(lVar2 + 0x30));
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

constexpr decltype(auto) matchPatternRangeImpl(RangeBegin &&rangeBegin,
                                                       PatternTuple &&patternTuple,
                                                       int32_t depth, ContextT &context,
                                                       std::index_sequence<I...>)
        {
            auto const func = [&](auto &&value, auto &&pattern)
            {
                return matchPattern(std::forward<decltype(value)>(value), pattern,
                                    depth + 1, context);
            };
            static_cast<void>(func);
            // Fix Me, avoid call next from begin every time.
            return (func(*std::next(rangeBegin, static_cast<long>(I)),
                         std::get<I + patternStartIdx>(patternTuple)) &&
                    ...);
        }